

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

int Diffusion::set_rho_flag(DiffusionForm compDiffusionType)

{
  ostringstream *this;
  int iVar1;
  ostream *os_;
  Print PStack_198;
  
  if (compDiffusionType < (Laplacian_S|Laplacian_SoverRho)) {
    iVar1 = *(int *)(&DAT_00703428 + (ulong)compDiffusionType * 4);
  }
  else {
    os_ = amrex::OutStream();
    amrex::Print::Print(&PStack_198,os_);
    this = &PStack_198.ss;
    std::operator<<((ostream *)this,"compDiffusionType = ");
    std::ostream::operator<<(this,compDiffusionType);
    std::operator<<((ostream *)this,'\n');
    amrex::Print::~Print(&PStack_198);
    amrex::Abort_host("An unknown NavierStokesBase::DiffusionForm was used in set_rho_flag");
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
Diffusion::set_rho_flag(const DiffusionForm compDiffusionType)
{
    int rho_flag = 0;

    switch (compDiffusionType)
    {
        case Laplacian_S:
            rho_flag = 0;
            break;

        case RhoInverse_Laplacian_S:
            rho_flag = 1;
            break;

        case Laplacian_SoverRho:
            rho_flag = 2;
            break;

        //NOTE: rho_flag = 3 is used in a different context for
        //      do_mom_diff==1

        default:
            amrex::Print() << "compDiffusionType = " << compDiffusionType << '\n';
            amrex::Abort("An unknown NavierStokesBase::DiffusionForm was used in set_rho_flag");
    }

    return rho_flag;
}